

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connect.c
# Opt level: O1

CURLcode cf_he_connect(Curl_cfilter *cf,Curl_easy *data,_Bool blocking,_Bool *done)

{
  uchar uVar1;
  byte bVar2;
  int iVar3;
  uint uVar4;
  void *pvVar5;
  long *plVar6;
  connectdata *pcVar7;
  void *pvVar8;
  eyeballer *peVar9;
  curl_trc_feat *pcVar10;
  undefined8 *puVar11;
  ConnectBits CVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  undefined4 uVar15;
  undefined8 uVar16;
  undefined4 uVar17;
  undefined8 uVar18;
  undefined4 uVar19;
  CURLcode CVar20;
  timediff_t tVar21;
  Curl_addrinfo *pCVar22;
  Curl_addrinfo *pCVar23;
  int *piVar24;
  char *pcVar25;
  Curl_addrinfo *pCVar26;
  Curl_addrinfo *addr;
  CURLcode error;
  int added;
  int iVar27;
  int iVar28;
  long lVar29;
  bool bVar30;
  curltime cVar31;
  curltime newer;
  curltime newer_00;
  curltime newer_01;
  curltime older;
  curltime older_00;
  curltime older_01;
  curltime older_02;
  char *disphost;
  int port;
  int is_ipv6;
  ip_quadruple ipquad;
  char *host;
  
  if ((cf->field_0x24 & 1) != 0) {
    *done = true;
    return CURLE_OK;
  }
  pvVar5 = cf->ctx;
  *done = false;
  iVar27 = *(int *)((long)pvVar5 + 0x18);
  if (iVar27 == 2) {
    *done = true;
    return CURLE_OK;
  }
  if (iVar27 != 1) {
    if (iVar27 != 0) {
      return CURLE_OK;
    }
    plVar6 = *(long **)((long)pvVar5 + 0x10);
    pcVar7 = cf->conn;
    tVar21 = Curl_timeleft(data,(curltime *)0x0,true);
    if (-1 < tVar21) {
      cVar31 = Curl_now();
      *(time_t *)((long)pvVar5 + 0x38) = cVar31.tv_sec;
      *(int *)((long)pvVar5 + 0x40) = cVar31.tv_usec;
      uVar1 = pcVar7->ip_version;
      pCVar22 = (Curl_addrinfo *)*plVar6;
      if (uVar1 == '\x01') {
        iVar27 = 2;
        for (; pCVar22 != (Curl_addrinfo *)0x0; pCVar22 = pCVar22->ai_next) {
          if (pCVar22->ai_family == 2) goto LAB_0011b935;
        }
      }
      else {
        pCVar23 = pCVar22;
        if (uVar1 != '\x02') {
          for (; pCVar26 = pCVar22, pCVar23 != (Curl_addrinfo *)0x0; pCVar23 = pCVar23->ai_next) {
            if (pCVar23->ai_family == 10) goto joined_r0x0011b913;
          }
          pCVar23 = (Curl_addrinfo *)0x0;
joined_r0x0011b913:
          do {
            if (pCVar26 == (Curl_addrinfo *)0x0) goto LAB_0011b92b;
            if (pCVar26->ai_family == 2) goto LAB_0011bf4e;
            pCVar26 = pCVar26->ai_next;
          } while( true );
        }
        iVar27 = 10;
        for (; pCVar22 != (Curl_addrinfo *)0x0; pCVar22 = pCVar22->ai_next) {
          if (pCVar22->ai_family == 10) goto LAB_0011b935;
        }
      }
      iVar3 = 0;
      goto LAB_0011b8f3;
    }
    Curl_failf(data,"Connection time-out");
    CVar20 = CURLE_OPERATION_TIMEDOUT;
    goto LAB_0011b9b2;
  }
  goto LAB_0011b9c2;
LAB_0011b935:
  iVar28 = 0;
  pCVar23 = pCVar22;
LAB_0011b93b:
  pCVar26 = (Curl_addrinfo *)0x0;
  goto LAB_0011b93d;
LAB_0011b92b:
  pCVar26 = (Curl_addrinfo *)0x0;
LAB_0011bf4e:
  iVar27 = 10;
  iVar28 = 2;
  if (pCVar23 == (Curl_addrinfo *)0x0 && pCVar26 == (Curl_addrinfo *)0x0) {
    iVar3 = 2;
    if (pCVar22 == (Curl_addrinfo *)0x0) {
LAB_0011b8f3:
      iVar28 = iVar3;
      pCVar23 = (Curl_addrinfo *)0x0;
      goto LAB_0011b93b;
    }
    iVar27 = pCVar22->ai_family;
    pCVar26 = (Curl_addrinfo *)0x0;
    pCVar23 = pCVar22;
    do {
      if (pCVar23->ai_family == iVar27) goto LAB_0011b93d;
      pCVar23 = pCVar23->ai_next;
    } while (pCVar23 != (Curl_addrinfo *)0x0);
    pCVar23 = (Curl_addrinfo *)0x0;
  }
LAB_0011b93d:
  bVar30 = pCVar23 == (Curl_addrinfo *)0x0;
  pCVar22 = pCVar26;
  if (bVar30) {
    pCVar22 = (Curl_addrinfo *)0x0;
  }
  addr = pCVar26;
  if (!bVar30 || pCVar26 == (Curl_addrinfo *)0x0) {
    addr = pCVar23;
  }
  if (addr == (Curl_addrinfo *)0x0) {
    CVar20 = CURLE_COULDNT_CONNECT;
  }
  else {
    if (bVar30 && pCVar26 != (Curl_addrinfo *)0x0) {
      iVar27 = iVar28;
    }
    *(undefined8 *)((long)pvVar5 + 0x20) = 0;
    *(undefined8 *)((long)pvVar5 + 0x28) = 0;
    CVar20 = eyeballer_new((eyeballer **)((long)pvVar5 + 0x20),
                           *(cf_ip_connect_create **)((long)pvVar5 + 8),addr,iVar27,(eyeballer *)0x0
                           ,0,tVar21,EXPIRE_DNS_PER_NAME);
    if (CVar20 == CURLE_OK) {
      if ((data != (Curl_easy *)0x0) && (((data->set).field_0x8cd & 0x10) != 0)) {
        pcVar10 = (data->state).feat;
        if (pcVar10 == (curl_trc_feat *)0x0) {
          if (cf != (Curl_cfilter *)0x0) goto LAB_0011c22e;
        }
        else if ((cf != (Curl_cfilter *)0x0) && (0 < pcVar10->log_level)) {
LAB_0011c22e:
          if (0 < cf->cft->log_level) {
            peVar9 = *(eyeballer **)((long)pvVar5 + 0x20);
            Curl_trc_cf_infof(data,cf,"created %s (timeout %ldms)",peVar9->name,peVar9->timeoutms);
          }
        }
      }
      CVar20 = CURLE_OK;
      if (pCVar22 != (Curl_addrinfo *)0x0) {
        CVar20 = eyeballer_new((eyeballer **)((long)pvVar5 + 0x28),
                               *(cf_ip_connect_create **)((long)pvVar5 + 8),pCVar22,iVar28,
                               *(eyeballer **)((long)pvVar5 + 0x20),
                               (ulong)(data->set).happy_eyeballs_timeout,tVar21,EXPIRE_DNS_PER_NAME2
                              );
        if (CVar20 == CURLE_OK) {
          if ((data != (Curl_easy *)0x0) && (((data->set).field_0x8cd & 0x10) != 0)) {
            pcVar10 = (data->state).feat;
            if (pcVar10 == (curl_trc_feat *)0x0) {
              if (cf != (Curl_cfilter *)0x0) goto LAB_0011c2d9;
            }
            else if ((cf != (Curl_cfilter *)0x0) && (0 < pcVar10->log_level)) {
LAB_0011c2d9:
              if (0 < cf->cft->log_level) {
                peVar9 = *(eyeballer **)((long)pvVar5 + 0x28);
                Curl_trc_cf_infof(data,cf,"created %s (timeout %ldms)",peVar9->name,
                                  peVar9->timeoutms);
              }
            }
          }
          Curl_expire(data,(ulong)(data->set).happy_eyeballs_timeout,EXPIRE_HAPPY_EYEBALLS);
          CVar20 = CURLE_OK;
        }
      }
    }
  }
LAB_0011b9b2:
  if (CVar20 != CURLE_OK) {
    return CVar20;
  }
  *(undefined4 *)((long)pvVar5 + 0x18) = 1;
LAB_0011b9c2:
  pvVar8 = cf->ctx;
  pcVar7 = cf->conn;
  do {
    *done = false;
    cVar31 = Curl_now();
    ipquad.remote_ip._0_8_ = cVar31.tv_sec;
    ipquad.remote_ip._8_4_ = cVar31.tv_usec;
    lVar29 = 0;
    iVar28 = 0;
    iVar27 = 0;
    do {
      peVar9 = *(eyeballer **)((long)pvVar8 + lVar29 * 8 + 0x20);
      bVar30 = true;
      if ((peVar9 != (eyeballer *)0x0) && (bVar2 = peVar9->field_0x64, (bVar2 & 4) == 0)) {
        if ((bVar2 & 2) == 0) {
          iVar27 = iVar27 + 1;
        }
        else {
          *done = (_Bool)((bVar2 & 8) >> 3);
          if (((bVar2 & 8) == 0) && (peVar9->result == CURLE_OK)) {
            CVar20 = Curl_conn_cf_connect(peVar9->cf,data,false,done);
            peVar9->result = CVar20;
            if (CVar20 == CURLE_WEIRD_SERVER_REPLY) {
              peVar9->field_0x64 = peVar9->field_0x64 | 0x20;
            }
            else if (CVar20 == CURLE_OK) {
              if (*done == true) {
                peVar9->field_0x64 = peVar9->field_0x64 | 0xc;
              }
              else {
                cVar31.tv_usec._0_1_ = ipquad.remote_ip[8];
                cVar31.tv_usec._1_1_ = ipquad.remote_ip[9];
                cVar31.tv_usec._2_1_ = ipquad.remote_ip[10];
                cVar31.tv_usec._3_1_ = ipquad.remote_ip[0xb];
                cVar31.tv_sec._0_1_ = ipquad.remote_ip[0];
                cVar31.tv_sec._1_1_ = ipquad.remote_ip[1];
                cVar31.tv_sec._2_1_ = ipquad.remote_ip[2];
                cVar31.tv_sec._3_1_ = ipquad.remote_ip[3];
                cVar31.tv_sec._4_1_ = ipquad.remote_ip[4];
                cVar31.tv_sec._5_1_ = ipquad.remote_ip[5];
                cVar31.tv_sec._6_1_ = ipquad.remote_ip[6];
                cVar31.tv_sec._7_1_ = ipquad.remote_ip[7];
                uVar14 = (peVar9->started).tv_sec;
                uVar15 = (peVar9->started).tv_usec;
                older.tv_usec = uVar15;
                older.tv_sec = uVar14;
                cVar31._12_4_ = 0;
                older._12_4_ = 0;
                tVar21 = Curl_timediff(cVar31,older);
                if (peVar9->timeoutms <= tVar21) {
                  if (((data != (Curl_easy *)0x0) && (((data->set).field_0x8cd & 0x10) != 0)) &&
                     ((pcVar10 = (data->state).feat, pcVar10 == (curl_trc_feat *)0x0 ||
                      (0 < pcVar10->log_level)))) {
                    Curl_infof(data,"%s connect timeout after %ldms, move on!",peVar9->name);
                  }
                  peVar9->result = CURLE_OPERATION_TIMEDOUT;
                  peVar9->error = 0x6e;
                }
              }
            }
          }
          if ((data != (Curl_easy *)0x0) && (((data->set).field_0x8cd & 0x10) != 0)) {
            pcVar10 = (data->state).feat;
            if (pcVar10 == (curl_trc_feat *)0x0) {
              if (cf != (Curl_cfilter *)0x0) goto LAB_0011ba9f;
            }
            else if ((cf != (Curl_cfilter *)0x0) && (0 < pcVar10->log_level)) {
LAB_0011ba9f:
              if (0 < cf->cft->log_level) {
                Curl_trc_cf_infof(data,cf,"%s connect -> %d, connected=%d",peVar9->name,
                                  (ulong)peVar9->result,(ulong)*done);
              }
            }
          }
          if (peVar9->result == CURLE_OK) {
            if (*done == true) {
              *(eyeballer **)((long)pvVar8 + 0x30) = peVar9;
              *(undefined8 *)((long)pvVar8 + lVar29 * 8 + 0x20) = 0;
              bVar30 = false;
            }
            else {
              iVar28 = iVar28 + 1;
            }
          }
          else if ((peVar9->field_0x64 & 4) == 0) {
            iVar3 = peVar9->error;
            if (iVar3 != 0) {
              (data->state).os_errno = iVar3;
              piVar24 = __errno_location();
              *piVar24 = iVar3;
            }
            tVar21 = Curl_timeleft(data,(curltime *)&ipquad,true);
            if (cf->sockindex == 0) {
              pCVar22 = peVar9->addr;
              do {
                if ((pCVar22 == (Curl_addrinfo *)0x0) ||
                   (pCVar22 = pCVar22->ai_next, pCVar22 == (Curl_addrinfo *)0x0)) {
                  pCVar22 = (Curl_addrinfo *)0x0;
                  break;
                }
              } while (pCVar22->ai_family != peVar9->ai_family);
              peVar9->addr = pCVar22;
              if ((pCVar22 == (Curl_addrinfo *)0x0) && ((peVar9->field_0x64 & 0x20) != 0)) {
                peVar9->addr = peVar9->first;
                peVar9->field_0x64 = peVar9->field_0x64 & 0xdf | 1;
              }
              baller_start(cf,data,peVar9,tVar21);
            }
            else {
              peVar9->field_0x64 = peVar9->field_0x64 & 0xf1 | 6;
              peVar9->result = CURLE_COULDNT_CONNECT;
              peVar9->error = 0;
            }
            if ((peVar9->field_0x64 & 4) == 0) {
              if ((data != (Curl_easy *)0x0) && (((data->set).field_0x8cd & 0x10) != 0)) {
                pcVar10 = (data->state).feat;
                if (pcVar10 == (curl_trc_feat *)0x0) {
                  if (cf != (Curl_cfilter *)0x0) goto LAB_0011bc74;
                }
                else if ((cf != (Curl_cfilter *)0x0) && (0 < pcVar10->log_level)) {
LAB_0011bc74:
                  if (0 < cf->cft->log_level) {
                    Curl_trc_cf_infof(data,cf,"%s trying next",peVar9->name);
                  }
                }
              }
              iVar28 = iVar28 + 1;
              Curl_expire(data,0,EXPIRE_RUN_NOW);
            }
            else if ((data != (Curl_easy *)0x0) && (((data->set).field_0x8cd & 0x10) != 0)) {
              pcVar10 = (data->state).feat;
              if (pcVar10 == (curl_trc_feat *)0x0) {
                if (cf != (Curl_cfilter *)0x0) goto LAB_0011bcca;
              }
              else if ((cf != (Curl_cfilter *)0x0) && (0 < pcVar10->log_level)) {
LAB_0011bcca:
                if (0 < cf->cft->log_level) {
                  Curl_trc_cf_infof(data,cf,"%s done",peVar9->name);
                }
              }
            }
          }
        }
      }
    } while ((lVar29 == 0) && (lVar29 = 1, bVar30));
    if (*(long *)((long)pvVar8 + 0x30) != 0) {
      *done = true;
      CVar20 = CURLE_OK;
      goto LAB_0011c0ed;
    }
    if ((iVar28 != 0 || iVar27 != 0) &&
       (tVar21 = Curl_timeleft(data,(curltime *)&ipquad,true), tVar21 < 0)) {
      newer_00.tv_usec._0_1_ = ipquad.remote_ip[8];
      newer_00.tv_usec._1_1_ = ipquad.remote_ip[9];
      newer_00.tv_usec._2_1_ = ipquad.remote_ip[10];
      newer_00.tv_usec._3_1_ = ipquad.remote_ip[0xb];
      newer_00.tv_sec._0_1_ = ipquad.remote_ip[0];
      newer_00.tv_sec._1_1_ = ipquad.remote_ip[1];
      newer_00.tv_sec._2_1_ = ipquad.remote_ip[2];
      newer_00.tv_sec._3_1_ = ipquad.remote_ip[3];
      newer_00.tv_sec._4_1_ = ipquad.remote_ip[4];
      newer_00.tv_sec._5_1_ = ipquad.remote_ip[5];
      newer_00.tv_sec._6_1_ = ipquad.remote_ip[6];
      newer_00.tv_sec._7_1_ = ipquad.remote_ip[7];
      uVar16 = (data->progress).t_startsingle.tv_sec;
      uVar17 = (data->progress).t_startsingle.tv_usec;
      older_01.tv_usec = uVar17;
      older_01.tv_sec = uVar16;
      newer_00._12_4_ = 0;
      older_01._12_4_ = 0;
      tVar21 = Curl_timediff(newer_00,older_01);
      Curl_failf(data,"Connection timeout after %ld ms",tVar21);
      CVar20 = CURLE_OPERATION_TIMEDOUT;
      goto LAB_0011c0ed;
    }
    if (iVar27 < 1) break;
    iVar27 = 0;
    lVar29 = 0;
    do {
      peVar9 = *(eyeballer **)((long)pvVar8 + lVar29 * 8 + 0x20);
      if (((peVar9 != (eyeballer *)0x0) && ((peVar9->field_0x64 & 2) == 0)) &&
         (((peVar9->primary != (eyeballer *)0x0 && ((peVar9->primary->field_0x64 & 4) != 0)) ||
          (newer.tv_usec._0_1_ = ipquad.remote_ip[8], newer.tv_usec._1_1_ = ipquad.remote_ip[9],
          newer.tv_usec._2_1_ = ipquad.remote_ip[10], newer.tv_usec._3_1_ = ipquad.remote_ip[0xb],
          newer.tv_sec._0_1_ = ipquad.remote_ip[0], newer.tv_sec._1_1_ = ipquad.remote_ip[1],
          newer.tv_sec._2_1_ = ipquad.remote_ip[2], newer.tv_sec._3_1_ = ipquad.remote_ip[3],
          newer.tv_sec._4_1_ = ipquad.remote_ip[4], newer.tv_sec._5_1_ = ipquad.remote_ip[5],
          newer.tv_sec._6_1_ = ipquad.remote_ip[6], newer.tv_sec._7_1_ = ipquad.remote_ip[7],
          newer._12_4_ = 0, older_00._12_4_ = 0,
          older_00._0_12_ = *(undefined1 (*) [12])((long)pvVar8 + 0x38),
          tVar21 = Curl_timediff(newer,older_00), peVar9->delay_ms <= tVar21)))) {
        tVar21 = Curl_timeleft(data,(curltime *)&ipquad,true);
        baller_start(cf,data,peVar9,tVar21);
        if ((peVar9->field_0x64 & 4) == 0) {
          if ((data != (Curl_easy *)0x0) && (((data->set).field_0x8cd & 0x10) != 0)) {
            pcVar10 = (data->state).feat;
            if (pcVar10 == (curl_trc_feat *)0x0) {
              if (cf != (Curl_cfilter *)0x0) goto LAB_0011bdf7;
            }
            else if ((cf != (Curl_cfilter *)0x0) && (0 < pcVar10->log_level)) {
LAB_0011bdf7:
              if (0 < cf->cft->log_level) {
                Curl_trc_cf_infof(data,cf,"%s starting (timeout=%ldms)",peVar9->name,
                                  peVar9->timeoutms);
              }
            }
          }
          iVar28 = iVar28 + 1;
          iVar27 = iVar27 + 1;
        }
        else if ((data != (Curl_easy *)0x0) && (((data->set).field_0x8cd & 0x10) != 0)) {
          pcVar10 = (data->state).feat;
          if (pcVar10 == (curl_trc_feat *)0x0) {
            if (cf != (Curl_cfilter *)0x0) goto LAB_0011be38;
          }
          else if ((cf != (Curl_cfilter *)0x0) && (0 < pcVar10->log_level)) {
LAB_0011be38:
            if (0 < cf->cft->log_level) {
              Curl_trc_cf_infof(data,cf,"%s done",peVar9->name);
            }
          }
        }
      }
      lVar29 = lVar29 + 1;
    } while (lVar29 == 1);
  } while (0 < iVar27);
  if (iVar28 < 1) {
    if ((data != (Curl_easy *)0x0) && (((data->set).field_0x8cd & 0x10) != 0)) {
      pcVar10 = (data->state).feat;
      if (pcVar10 == (curl_trc_feat *)0x0) {
        if (cf != (Curl_cfilter *)0x0) goto LAB_0011bf95;
      }
      else if ((cf != (Curl_cfilter *)0x0) && (0 < pcVar10->log_level)) {
LAB_0011bf95:
        if (0 < cf->cft->log_level) {
          Curl_trc_cf_infof(data,cf,"all eyeballers failed");
        }
      }
    }
    error = CURLE_COULDNT_CONNECT;
    lVar29 = 0;
    do {
      puVar11 = *(undefined8 **)((long)pvVar8 + lVar29 + 0x20);
      bVar30 = true;
      if (puVar11 != (undefined8 *)0x0) {
        if ((data != (Curl_easy *)0x0) && (((data->set).field_0x8cd & 0x10) != 0)) {
          pcVar10 = (data->state).feat;
          if (pcVar10 == (curl_trc_feat *)0x0) {
            if (cf != (Curl_cfilter *)0x0) goto LAB_0011bffb;
          }
          else if ((cf != (Curl_cfilter *)0x0) && (0 < pcVar10->log_level)) {
LAB_0011bffb:
            if (0 < cf->cft->log_level) {
              Curl_trc_cf_infof(data,cf,"%s assess started=%d, result=%d",*puVar11,
                                (ulong)(*(uint *)((long)puVar11 + 100) >> 1 & 1),
                                (ulong)*(uint *)((long)puVar11 + 0x5c));
            }
          }
        }
        if (((*(byte *)((long)puVar11 + 100) & 2) != 0) &&
           (*(CURLcode *)((long)puVar11 + 0x5c) != CURLE_OK)) {
          bVar30 = false;
          error = *(CURLcode *)((long)puVar11 + 0x5c);
        }
      }
    } while ((lVar29 == 0) && (lVar29 = 8, bVar30));
    CVar12 = pcVar7->bits;
    lVar29 = 0xb8;
    if ((((ulong)CVar12 & 2) == 0) &&
       ((lVar29 = 0xf0, ((ulong)CVar12 & 1) == 0 && (lVar29 = 0x98, (CVar12._0_4_ >> 8 & 1) == 0))))
    {
      lVar29 = 0x68;
    }
    uVar13 = *(undefined8 *)((long)&(pcVar7->cpool_node)._list + lVar29);
    uVar4 = (pcVar7->primary).remote_port;
    newer_01.tv_usec._0_1_ = ipquad.remote_ip[8];
    newer_01.tv_usec._1_1_ = ipquad.remote_ip[9];
    newer_01.tv_usec._2_1_ = ipquad.remote_ip[10];
    newer_01.tv_usec._3_1_ = ipquad.remote_ip[0xb];
    newer_01.tv_sec._0_1_ = ipquad.remote_ip[0];
    newer_01.tv_sec._1_1_ = ipquad.remote_ip[1];
    newer_01.tv_sec._2_1_ = ipquad.remote_ip[2];
    newer_01.tv_sec._3_1_ = ipquad.remote_ip[3];
    newer_01.tv_sec._4_1_ = ipquad.remote_ip[4];
    newer_01.tv_sec._5_1_ = ipquad.remote_ip[5];
    newer_01.tv_sec._6_1_ = ipquad.remote_ip[6];
    newer_01.tv_sec._7_1_ = ipquad.remote_ip[7];
    uVar18 = (data->progress).t_startsingle.tv_sec;
    uVar19 = (data->progress).t_startsingle.tv_usec;
    older_02.tv_usec = uVar19;
    older_02.tv_sec = uVar18;
    newer_01._12_4_ = 0;
    older_02._12_4_ = 0;
    tVar21 = Curl_timediff(newer_01,older_02);
    pcVar25 = curl_easy_strerror(error);
    Curl_failf(data,"Failed to connect to %s port %u after %ld ms: %s",uVar13,(ulong)uVar4,tVar21,
               pcVar25);
    CVar20 = CURLE_OPERATION_TIMEDOUT;
    if ((data->state).os_errno != 0x6e) {
      CVar20 = error;
    }
  }
  else {
    *done = false;
    CVar20 = CURLE_OK;
  }
LAB_0011c0ed:
  if (CVar20 != CURLE_OK) {
    return CVar20;
  }
  if (*done != true) {
    return CURLE_OK;
  }
  *(undefined4 *)((long)pvVar5 + 0x18) = 2;
  cf->field_0x24 = cf->field_0x24 | 1;
  lVar29 = *(long *)((long)pvVar5 + 0x30);
  cf->next = *(Curl_cfilter **)(lVar29 + 0x28);
  *(undefined8 *)(lVar29 + 0x28) = 0;
  cf_he_ctx_clear(cf,data);
  if ((cf->conn->handler->protocol & 0x30) != 0) {
    Curl_pgrsTime(data,TIMER_APPCONNECT);
  }
  if ((data != (Curl_easy *)0x0) && (((data->set).field_0x8cd & 0x10) != 0)) {
    pcVar10 = (data->state).feat;
    if (pcVar10 == (curl_trc_feat *)0x0) {
      if (cf == (Curl_cfilter *)0x0) goto LAB_0011c163;
    }
    else if ((cf == (Curl_cfilter *)0x0) || (pcVar10->log_level < 1)) goto LAB_0011c163;
    if ((((0 < cf->cft->log_level) &&
         ((CVar20 = Curl_conn_cf_get_ip_info(cf->next,data,&is_ipv6,&ipquad), CVar20 == CURLE_OK &&
          ((*cf->next->cft->get_host)(cf->next,data,&host,&disphost,&port),
          ((data->set).field_0x8cd & 0x10) != 0)))) &&
        ((pcVar10 = (data->state).feat, pcVar10 == (curl_trc_feat *)0x0 || (0 < pcVar10->log_level))
        )) && (0 < cf->cft->log_level)) {
      Curl_trc_cf_infof(data,cf,"Connected to %s (%s) port %u",disphost,&ipquad,
                        (ulong)(uint)ipquad.remote_port);
    }
  }
LAB_0011c163:
  plVar6 = &(data->info).numconnects;
  *plVar6 = *plVar6 + 1;
  return CURLE_OK;
}

Assistant:

static CURLcode cf_he_connect(struct Curl_cfilter *cf,
                              struct Curl_easy *data,
                              bool blocking, bool *done)
{
  struct cf_he_ctx *ctx = cf->ctx;
  CURLcode result = CURLE_OK;

  if(cf->connected) {
    *done = TRUE;
    return CURLE_OK;
  }

  (void)blocking; /* TODO: do we want to support this? */
  DEBUGASSERT(ctx);
  *done = FALSE;

  switch(ctx->state) {
    case SCFST_INIT:
      DEBUGASSERT(CURL_SOCKET_BAD == Curl_conn_cf_get_socket(cf, data));
      DEBUGASSERT(!cf->connected);
      result = start_connect(cf, data, ctx->remotehost);
      if(result)
        return result;
      ctx->state = SCFST_WAITING;
      FALLTHROUGH();
    case SCFST_WAITING:
      result = is_connected(cf, data, done);
      if(!result && *done) {
        DEBUGASSERT(ctx->winner);
        DEBUGASSERT(ctx->winner->cf);
        DEBUGASSERT(ctx->winner->cf->connected);
        /* we have a winner. Install and activate it.
         * close/free all others. */
        ctx->state = SCFST_DONE;
        cf->connected = TRUE;
        cf->next = ctx->winner->cf;
        ctx->winner->cf = NULL;
        cf_he_ctx_clear(cf, data);

        if(cf->conn->handler->protocol & PROTO_FAMILY_SSH)
          Curl_pgrsTime(data, TIMER_APPCONNECT); /* we are connected already */
        if(Curl_trc_cf_is_verbose(cf, data)) {
          struct ip_quadruple ipquad;
          int is_ipv6;
          if(!Curl_conn_cf_get_ip_info(cf->next, data, &is_ipv6, &ipquad)) {
            const char *host, *disphost;
            int port;
            cf->next->cft->get_host(cf->next, data, &host, &disphost, &port);
            CURL_TRC_CF(data, cf, "Connected to %s (%s) port %u",
                        disphost, ipquad.remote_ip, ipquad.remote_port);
          }
        }
        data->info.numconnects++; /* to track the # of connections made */
      }
      break;
    case SCFST_DONE:
      *done = TRUE;
      break;
  }
  return result;
}